

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O0

void __thiscall Pda::addNode(Pda *this,string *name,bool start,bool end)

{
  Node *this_00;
  string local_48;
  Node *local_28;
  Node *n;
  bool end_local;
  string *psStack_18;
  bool start_local;
  string *name_local;
  Pda *this_local;
  
  n._6_1_ = end;
  n._7_1_ = start;
  psStack_18 = name;
  name_local = &this->alphabet;
  this_00 = (Node *)operator_new(0x88);
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  Tjen::Node::Node(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_28 = this_00;
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back(&this->allNodes,&local_28);
  if ((n._7_1_ & 1) != 0) {
    this->start = local_28;
  }
  if ((n._6_1_ & 1) != 0) {
    std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back(&this->endNodes,&local_28);
  }
  return;
}

Assistant:

void Pda::addNode(std::string name, bool start, bool end) {
    Tjen::Node * n = new Tjen::Node(name);
    this->allNodes.push_back(n);

    if(start){
        this->start = n;
    }
    if(end){
        this->endNodes.push_back(n);
    }
}